

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

align_t fmt::v10::detail::parse_align(char c)

{
  char c_local;
  undefined1 local_1;
  
  if (c == '<') {
    local_1 = left;
  }
  else if (c == '>') {
    local_1 = right;
  }
  else if (c == '^') {
    local_1 = center;
  }
  else {
    local_1 = none;
  }
  return local_1;
}

Assistant:

FMT_CONSTEXPR inline auto parse_align(char c) -> align_t {
  switch (c) {
  case '<':
    return align::left;
  case '>':
    return align::right;
  case '^':
    return align::center;
  }
  return align::none;
}